

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCompiler.cpp
# Opt level: O3

void __thiscall
Refal2::CLeftPartCompiler::CompileLeftPart
          (CLeftPartCompiler *this,CUnitList *leftPart,bool isRightDirection)

{
  CNodeType **ppCVar1;
  CVariables *this_00;
  int iVar2;
  CNodeType *pCVar3;
  bool bVar4;
  CNodeType *pCVar5;
  CNodeType **ppCVar6;
  CHole local_40;
  
  this->top = 2;
  local_40.super_CUnitList.super_CNodeList<Refal2::CUnit>.first = (CNodeType *)0x0;
  local_40.super_CUnitList.super_CNodeList<Refal2::CUnit>.last = (CNodeType *)0x0;
  local_40.super_CUnitList.super_CNodeList<Refal2::CUnit>._vptr_CNodeList =
       (_func_int **)&PTR__CNodeList_00148978;
  local_40.left = 0;
  local_40.right = 1;
  if (&local_40 != (CHole *)leftPart) {
    local_40.super_CUnitList.super_CNodeList<Refal2::CUnit>.first =
         (leftPart->super_CNodeList<Refal2::CUnit>).first;
    local_40.super_CUnitList.super_CNodeList<Refal2::CUnit>.last =
         (leftPart->super_CNodeList<Refal2::CUnit>).last;
    (leftPart->super_CNodeList<Refal2::CUnit>).first = (CNodeType *)0x0;
    (leftPart->super_CNodeList<Refal2::CUnit>).last = (CNodeType *)0x0;
  }
  CNodeList<Refal2::CHole>::Append(&this->holes,&local_40);
  CNodeList<Refal2::CUnit>::~CNodeList((CNodeList<Refal2::CUnit> *)&local_40);
  pCVar5 = (this->holes).first;
  this->lastUsedHole = pCVar5;
  this->hole = pCVar5;
  if (pCVar5 != (CNodeType *)0x0) {
    ppCVar1 = &(this->holes).first;
    this_00 = &(this->super_CFunctionCompilerBase).variables;
    do {
      do {
        pCVar3 = (pCVar5->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.first;
        if (((pCVar3 == (CNodeType *)0x0) ||
            (pCVar3 == (pCVar5->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.last))
           || (((pCVar3->super_CUnit).type & UT_Variable) == 0)) {
LAB_0011fe35:
          matchElement(this);
          ppCVar6 = ppCVar1;
        }
        else {
          iVar2 = (pCVar3->super_CUnit).field_1.variable;
          if (((long)iVar2 < 0) ||
             ((this->super_CFunctionCompilerBase).variables.variablesSize <= iVar2)) {
LAB_0011fe99:
            __assert_fail("IsValidVariableIndex( variableIndex )",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/Variables.h"
                          ,0x7c,
                          "const CVariable &Refal2::CVariables::GetVariable(TVariableIndex) const");
          }
          if (((1 < this_00->variables[iVar2].type - VT_V) ||
              ((bVar4 = CVariables::IsSet(this_00,iVar2), bVar4 ||
               (pCVar3 = (this->hole->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.
                         last, pCVar3 == (CNodeType *)0x0)))) ||
             (((pCVar3->super_CUnit).type & UT_Variable) == 0)) goto LAB_0011fe35;
          iVar2 = (pCVar3->super_CUnit).field_1.variable;
          if (((long)iVar2 < 0) ||
             ((this->super_CFunctionCompilerBase).variables.variablesSize <= iVar2))
          goto LAB_0011fe99;
          if ((1 < this_00->variables[iVar2].type - VT_V) ||
             (bVar4 = CVariables::IsSet(this_00,iVar2), bVar4)) goto LAB_0011fe35;
          ppCVar6 = &this->hole->next;
        }
        pCVar5 = *ppCVar6;
        this->hole = pCVar5;
      } while (pCVar5 != (CNodeType *)0x0);
      pCVar5 = *ppCVar1;
      if (pCVar5 == (CNodeType *)0x0) break;
      this->hole = pCVar5;
      matchVE(this,isRightDirection);
      pCVar5 = (this->holes).first;
      this->hole = pCVar5;
    } while (pCVar5 != (CNodeType *)0x0);
  }
  if (this->maxTableSize < this->top) {
    this->maxTableSize = this->top;
  }
  return;
}

Assistant:

void CLeftPartCompiler::CompileLeftPart( CUnitList& leftPart,
	bool isRightDirection )
{
	top = 2;
	holes.Append( CHole( leftPart, 0 /* left */, 1 /* right */ ) );
	lastUsedHole = holes.GetFirst();

	while( true ) {
		hole = holes.GetFirst();

		while( hole != 0 ) {
			if( hole->GetFirst() != hole->GetLast()
				&& isFreeVE( hole->GetFirst() ) && isFreeVE( hole->GetLast() ) )
			{
				hole = hole->Next();
			} else {
				matchElement();
				hole = holes.GetFirst();
			}
		}

		if( holes.IsEmpty() ) {
			break;
		} else {
			hole = holes.GetFirst();
			matchVE( isRightDirection );
		}
	}

	if( top > maxTableSize ) {
		maxTableSize = top;
	}
}